

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

void addDisc(BamAlignment *aln,int *bpRegion,vector<DiscNode,_std::allocator<DiscNode>_> *nodes)

{
  pointer *ppDVar1;
  int iVar2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  DiscNode dn;
  vector<int,_std::allocator<int>_> genomePositions;
  vector<int,_std::allocator<int>_> readPositions;
  vector<int,_std::allocator<int>_> clipSizes;
  DiscNode local_a0;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  bVar3 = BamTools::BamAlignment::IsMapped(aln);
  if (((bVar3) && (bVar3 = BamTools::BamAlignment::IsMateMapped(aln), bVar3)) &&
     (bVar3 = BamTools::BamAlignment::IsProperPair(aln), !bVar3)) {
    iVar10 = aln->Position;
    iVar6 = BamTools::BamAlignment::GetEndPosition(aln,false,false);
    bVar4 = BamTools::BamAlignment::IsReverseStrand(aln);
    iVar2 = aln->MatePosition;
    iVar9 = aln->Length + iVar2;
    bVar5 = BamTools::BamAlignment::IsMateReverseStrand(aln);
    iVar7 = aln->InsertSize;
    bVar3 = aln->Position <= aln->MatePosition;
    iVar13 = iVar9;
    iVar12 = iVar2;
    bVar8 = bVar4;
    if (!bVar3) {
      iVar7 = -iVar7;
      iVar13 = iVar6;
      iVar12 = iVar10;
      iVar10 = iVar2;
      iVar6 = iVar9;
      bVar8 = bVar5;
      bVar5 = bVar4;
    }
    uVar11 = (uint)bVar3;
    if ((bVar5 == true && bVar8 == false) && iVar7 < 50000) {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bVar3 = BamTools::BamAlignment::GetSoftClips(aln,&local_48,&local_68,&local_88,false);
      if (!bVar3) {
        local_a0.refID = aln->RefID;
        __position._M_current =
             (nodes->super__Vector_base<DiscNode,_std::allocator<DiscNode>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_a0.upStart = iVar10;
        local_a0.upEnd = iVar6;
        local_a0.downStart = iVar12;
        local_a0.downEnd = iVar13;
        local_a0.support = uVar11;
        if (__position._M_current ==
            (nodes->super__Vector_base<DiscNode,_std::allocator<DiscNode>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<DiscNode,std::allocator<DiscNode>>::_M_realloc_insert<DiscNode&>
                    ((vector<DiscNode,std::allocator<DiscNode>> *)nodes,__position,&local_a0);
        }
        else {
          (__position._M_current)->support = uVar11;
          (__position._M_current)->refID = local_a0.refID;
          (__position._M_current)->upStart = iVar10;
          (__position._M_current)->upEnd = iVar6;
          (__position._M_current)->downStart = iVar12;
          (__position._M_current)->downEnd = iVar13;
          ppDVar1 = &(nodes->super__Vector_base<DiscNode,_std::allocator<DiscNode>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
      }
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void addDisc(BamTools::BamAlignment &aln, const int &bpRegion, std::vector<DiscNode> &nodes)
{
	// both reads should be mapped
	if (!aln.IsMapped() || !aln.IsMateMapped())
		return;
	if (aln.IsProperPair())
		return;

	int upSt = aln.Position;
	int upEn = aln.GetEndPosition();
	bool upIsRev = aln.IsReverseStrand();
	int downSt = aln.MatePosition;
	int downEn = downSt + aln.Length;
	bool downIsRev = aln.IsMateReverseStrand();
	int insSz = aln.InsertSize;
	int support = 1;

	// current read is 3` and its mate at 5`
	if (aln.Position > aln.MatePosition)
	{
		std::swap(upSt, downSt);
		std::swap(upEn, downEn);
		std::swap(upIsRev, downIsRev);
		insSz *= -1;
		// do not add the same read twice
		support = 0;
	}

	if (insSz >= MAX_LARGE_DEL_LEN)
		return;

	// up should be forward and down should be reverse
	if (upIsRev || !downIsRev)
		return;

	std::vector<int> clipSizes, readPositions, genomePositions;
	bool isSC = aln.GetSoftClips(clipSizes, readPositions, genomePositions);
	// read should not have SC
	if (isSC)
		return;

	DiscNode dn(upSt, upEn, downSt, downEn, aln.RefID, support);
	nodes.emplace_back(dn);
}